

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O2

int lua_getstack(lua_State *L,int level,lua_Debug *ar)

{
  int iVar1;
  undefined8 in_RAX;
  cTValue *pcVar2;
  int size;
  
  size = (int)((ulong)in_RAX >> 0x20);
  pcVar2 = lj_debug_frame(L,level,&size);
  if (pcVar2 == (cTValue *)0x0) {
    iVar1 = level - size;
  }
  else {
    iVar1 = (int)((long)pcVar2 - (L->stack).ptr64 >> 3) + size * 0x10000;
  }
  ar->i_ci = iVar1;
  return (uint)(pcVar2 != (cTValue *)0x0);
}

Assistant:

LUA_API int lua_getstack(lua_State *L, int level, lua_Debug *ar)
{
  int size;
  cTValue *frame = lj_debug_frame(L, level, &size);
  if (frame) {
    ar->i_ci = (size << 16) + (int)(frame - tvref(L->stack));
    return 1;
  } else {
    ar->i_ci = level - size;
    return 0;
  }
}